

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O3

void gimage::expandGauss<unsigned_short,unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *target,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image)

{
  long i_00;
  long i_01;
  long lVar1;
  long lVar2;
  bool bVar3;
  long h;
  long lVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long w;
  unsigned_short *puVar9;
  long i;
  long lVar10;
  int j;
  long lVar11;
  long lVar12;
  float fVar13;
  
  lVar1 = image->width;
  lVar2 = image->height;
  w = lVar1 * 2;
  h = lVar2 * 2;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (target,w,h,(long)image->depth);
  if (0 < target->depth) {
    lVar4 = h + -2;
    i_00 = w + -2;
    i_01 = w + -1;
    lVar11 = 0;
    lVar6 = 0;
    if (0 < lVar4) {
      lVar6 = lVar4;
    }
    if (w < 2) {
      w = 1;
    }
    lVar8 = 3;
    if (3 < i_00) {
      lVar8 = i_00;
    }
    lVar7 = 3;
    if (3 < lVar4) {
      lVar7 = lVar4;
    }
    do {
      if (0 < lVar2) {
        puVar9 = *target->img[lVar11];
        bVar5 = 1;
        lVar4 = 0;
        do {
          j = (int)lVar11;
          if (0 < lVar1) {
            lVar12 = 0;
            lVar10 = 0;
            do {
              fVar13 = expandGaussPixel<unsigned_short>(image,lVar10,lVar4,j);
              puVar9[lVar10] = (unsigned_short)(int)fVar13;
              lVar10 = lVar10 + 1;
              lVar12 = lVar12 + -2;
            } while (w != lVar10);
            puVar9 = (unsigned_short *)((long)puVar9 - lVar12);
          }
          lVar10 = lVar4 + 1;
          lVar4 = 1;
          bVar3 = (bool)(bVar5 & lVar10 < h);
          bVar5 = 0;
        } while (bVar3);
        if (2 < lVar2) {
          lVar4 = 2;
          do {
            if (0 < lVar1) {
              fVar13 = expandGaussPixel<unsigned_short>(image,0,lVar4,j);
              *puVar9 = (unsigned_short)(int)fVar13;
              fVar13 = expandGaussPixel<unsigned_short>(image,1,lVar4,j);
              puVar9[1] = (unsigned_short)(int)fVar13;
              if (lVar1 < 3) {
                puVar9 = puVar9 + 2;
              }
              else {
                lVar12 = 2;
                lVar10 = -4;
                do {
                  fVar13 = expandGaussPixelInner<unsigned_short>(image,lVar12,lVar4,j);
                  puVar9[lVar12] = (unsigned_short)(int)fVar13;
                  lVar12 = lVar12 + 1;
                  lVar10 = lVar10 + -2;
                } while (lVar8 != lVar12);
                puVar9 = (unsigned_short *)((long)puVar9 - lVar10);
              }
              if (1 < lVar1) {
                fVar13 = expandGaussPixel<unsigned_short>(image,i_00,lVar4,j);
                *puVar9 = (unsigned_short)(int)fVar13;
                fVar13 = expandGaussPixel<unsigned_short>(image,i_01,lVar4,j);
                puVar9[1] = (unsigned_short)(int)fVar13;
                puVar9 = puVar9 + 2;
              }
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != lVar7);
        }
        lVar4 = lVar6;
        if (0 < lVar2) {
          do {
            if (0 < lVar1) {
              lVar12 = 0;
              lVar10 = 0;
              do {
                fVar13 = expandGaussPixel<unsigned_short>(image,lVar10,lVar4,j);
                puVar9[lVar10] = (unsigned_short)(int)fVar13;
                lVar10 = lVar10 + 1;
                lVar12 = lVar12 + -2;
              } while (w != lVar10);
              puVar9 = (unsigned_short *)((long)puVar9 - lVar12);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < h);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < target->depth);
  }
  return;
}

Assistant:

void expandGauss(Image<T> &target, const Image<S> &image)
{
  const long w=2*image.getWidth();
  const long h=2*image.getHeight();

  target.setSize(w, h, image.getDepth());

  // for all color channels

  for (int d=0; d<target.getDepth(); d++)
  {
    T *p=target.getPtr(0, 0, d);
    for (long k=0; k<2 && k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        *p++=static_cast<T>(expandGaussPixel(image, i, k, d));
      }
    }

    for (long k=2; k<h-2; k++)
    {
      if (w > 0) *p++=static_cast<T>(expandGaussPixel(image, 0, k, d));
      if (w > 1) *p++=static_cast<T>(expandGaussPixel(image, 1, k, d));

      for (long i=2; i<w-2; i++)
      {
        *p++=static_cast<T>(expandGaussPixelInner(image, i, k, d));
      }

      if (w > 2) *p++=static_cast<T>(expandGaussPixel(image, w-2, k, d));
      if (w > 3) *p++=static_cast<T>(expandGaussPixel(image, w-1, k, d));
    }

    for (long k=std::max(0l, h-2); k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        *p++=static_cast<T>(expandGaussPixel(image, i, k, d));
      }
    }
  }
}